

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

char * fts5ExprPrint(Fts5Config *pConfig,Fts5ExprNode *pExpr)

{
  ulong uVar1;
  Fts5ExprTerm *pFVar2;
  uint uVar3;
  Fts5ExprNearset *pFVar4;
  Fts5ExprPhrase *pFVar5;
  char *pcVar6;
  char *pcVar7;
  size_t sVar8;
  void *p;
  int iVar9;
  char *pcVar10;
  Fts5ExprTerm *pFVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  Fts5ExprTerm *pFVar15;
  char cVar16;
  sqlite3_uint64 n;
  char *pcVar17;
  int i;
  long lVar18;
  char *zOp;
  char *pcVar19;
  long lVar20;
  
  switch(pExpr->eType) {
  case 0:
    pcVar7 = sqlite3_mprintf("\"\"");
    return pcVar7;
  default:
    pcVar19 = " OR ";
    break;
  case 2:
    pcVar19 = " AND ";
    break;
  case 3:
    pcVar19 = " NOT ";
    break;
  case 4:
  case 9:
    pFVar4 = pExpr->pNear;
    if (pFVar4->pColset == (Fts5Colset *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = fts5PrintfAppend((char *)0x0,"%s : ",pConfig->azCol[pFVar4->pColset->aiCol[0]]);
      if (pcVar7 == (char *)0x0) {
        return (char *)0x0;
      }
    }
    if ((1 < pFVar4->nPhrase) && (pcVar7 = fts5PrintfAppend(pcVar7,"NEAR("), pcVar7 == (char *)0x0))
    {
      return (char *)0x0;
    }
    lVar18 = 0;
    do {
      if (pFVar4->nPhrase <= lVar18) {
        if (1 < pFVar4->nPhrase) {
          pcVar7 = fts5PrintfAppend(pcVar7,", %d)",(ulong)(uint)pFVar4->nNear);
          return pcVar7;
        }
        return pcVar7;
      }
      pFVar5 = pFVar4->apPhrase[lVar18];
      if ((lVar18 != 0) && (pcVar7 = fts5PrintfAppend(pcVar7," "), pcVar7 == (char *)0x0)) {
        return (char *)0x0;
      }
      lVar20 = 0;
      while (lVar20 < pFVar5->nTerm) {
        sVar8 = strlen(pFVar5->aTerm[lVar20].zTerm);
        n = 0;
        pFVar2 = pFVar5->aTerm + lVar20;
        for (pFVar11 = pFVar2; pFVar11 != (Fts5ExprTerm *)0x0; pFVar11 = pFVar11->pSynonym) {
          n = n + (long)((int)sVar8 * 2 + 5);
        }
        p = sqlite3_malloc64(n);
        if (p == (void *)0x0) goto LAB_001c0b93;
        uVar13 = 0;
        pFVar11 = pFVar2;
LAB_001c0ab9:
        pFVar15 = pFVar11;
        iVar9 = (int)uVar13;
        if (pFVar15 != (Fts5ExprTerm *)0x0) {
          pcVar19 = pFVar15->zTerm;
          cVar16 = '\"';
          uVar13 = uVar13 & 0xffffffff;
          do {
            iVar9 = (int)uVar13;
            lVar12 = (long)iVar9;
            *(char *)((long)p + lVar12) = cVar16;
            uVar1 = lVar12 + 1;
            cVar16 = *pcVar19;
            if (cVar16 == '\"') {
              uVar13 = (ulong)(iVar9 + 2);
              *(undefined1 *)((long)p + uVar1) = 0x22;
              cVar16 = *pcVar19;
            }
            else {
              if (cVar16 == '\0') goto LAB_001c0af6;
              uVar13 = uVar1 & 0xffffffff;
            }
            pcVar19 = pcVar19 + 1;
          } while( true );
        }
        if (pFVar2->bPrefix != '\0') {
          *(undefined2 *)((long)p + (long)iVar9) = 0x2a20;
          iVar9 = iVar9 + 2;
        }
        *(undefined1 *)((long)p + (long)iVar9) = 0;
        pcVar19 = " + ";
        if (lVar20 == 0) {
          pcVar19 = "";
        }
        pcVar7 = fts5PrintfAppend(pcVar7,"%s%s",pcVar19,p);
        sqlite3_free(p);
        lVar20 = lVar20 + 1;
        if (pcVar7 == (char *)0x0) {
          pcVar7 = (char *)0x0;
          goto LAB_001c0b93;
        }
      }
      lVar18 = lVar18 + 1;
    } while( true );
  }
  lVar18 = 0;
  pcVar7 = (char *)0x0;
  do {
    if (pExpr->nChild <= lVar18) {
      return pcVar7;
    }
    pcVar6 = fts5ExprPrint(pConfig,pExpr->apChild[lVar18]);
    if (pcVar6 == (char *)0x0) {
LAB_001c0b93:
      sqlite3_free(pcVar7);
      return (char *)0x0;
    }
    uVar3 = pExpr->apChild[lVar18]->eType;
    if (uVar3 < 10) {
      pcVar10 = "";
      pcVar17 = "";
      if ((0x211U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_001c09b9;
    }
    else {
LAB_001c09b9:
      pcVar10 = "(";
      pcVar17 = ")";
    }
    pcVar14 = pcVar19;
    if (lVar18 == 0) {
      pcVar14 = "";
    }
    pcVar7 = fts5PrintfAppend(pcVar7,"%s%s%z%s",pcVar14,pcVar10,pcVar6,pcVar17);
    lVar18 = lVar18 + 1;
    if (pcVar7 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
LAB_001c0af6:
  uVar13 = lVar12 + 2;
  *(undefined1 *)((long)p + uVar1) = 0x22;
  pFVar11 = (Fts5ExprTerm *)0x0;
  if (pFVar15->pSynonym != (Fts5ExprTerm *)0x0) {
    *(undefined1 *)((long)p + uVar13) = 0x7c;
    uVar13 = (ulong)(iVar9 + 3);
    pFVar11 = pFVar15->pSynonym;
  }
  goto LAB_001c0ab9;
}

Assistant:

static char *fts5ExprPrint(Fts5Config *pConfig, Fts5ExprNode *pExpr){
  char *zRet = 0;
  if( pExpr->eType==0 ){
    return sqlite3_mprintf("\"\"");
  }else
  if( pExpr->eType==FTS5_STRING || pExpr->eType==FTS5_TERM ){
    Fts5ExprNearset *pNear = pExpr->pNear;
    int i; 
    int iTerm;

    if( pNear->pColset ){
      int iCol = pNear->pColset->aiCol[0];
      zRet = fts5PrintfAppend(zRet, "%s : ", pConfig->azCol[iCol]);
      if( zRet==0 ) return 0;
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, "NEAR(");
      if( zRet==0 ) return 0;
    }

    for(i=0; i<pNear->nPhrase; i++){
      Fts5ExprPhrase *pPhrase = pNear->apPhrase[i];
      if( i!=0 ){
        zRet = fts5PrintfAppend(zRet, " ");
        if( zRet==0 ) return 0;
      }
      for(iTerm=0; iTerm<pPhrase->nTerm; iTerm++){
        char *zTerm = fts5ExprTermPrint(&pPhrase->aTerm[iTerm]);
        if( zTerm ){
          zRet = fts5PrintfAppend(zRet, "%s%s", iTerm==0?"":" + ", zTerm);
          sqlite3_free(zTerm);
        }
        if( zTerm==0 || zRet==0 ){
          sqlite3_free(zRet);
          return 0;
        }
      }
    }

    if( pNear->nPhrase>1 ){
      zRet = fts5PrintfAppend(zRet, ", %d)", pNear->nNear);
      if( zRet==0 ) return 0;
    }

  }else{
    char const *zOp = 0;
    int i;

    switch( pExpr->eType ){
      case FTS5_AND: zOp = " AND "; break;
      case FTS5_NOT: zOp = " NOT "; break;
      default:  
        assert( pExpr->eType==FTS5_OR );
        zOp = " OR "; 
        break;
    }

    for(i=0; i<pExpr->nChild; i++){
      char *z = fts5ExprPrint(pConfig, pExpr->apChild[i]);
      if( z==0 ){
        sqlite3_free(zRet);
        zRet = 0;
      }else{
        int e = pExpr->apChild[i]->eType;
        int b = (e!=FTS5_STRING && e!=FTS5_TERM && e!=FTS5_EOF);
        zRet = fts5PrintfAppend(zRet, "%s%s%z%s", 
            (i==0 ? "" : zOp),
            (b?"(":""), z, (b?")":"")
        );
      }
      if( zRet==0 ) break;
    }
  }

  return zRet;
}